

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_sink_set.cc
# Opt level: O2

void absl::lts_20250127::log_internal::FlushLogSinks(void)

{
  NoDestructor<absl::lts_20250127::log_internal::(anonymous_namespace)::GlobalLogSinkSet> *pNVar1;
  long in_FS_OFFSET;
  ReaderMutexLock global_sinks_lock;
  ReaderMutexLock local_10;
  
  anon_unknown_0::GlobalSinks();
  if (*(char *)(in_FS_OFFSET + -0x34) == '\x01') {
    pNVar1 = &anon_unknown_0::GlobalSinks::global_sinks;
    Mutex::AssertReaderHeld((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
    anon_unknown_0::GlobalLogSinkSet::FlushLogSinksLocked((GlobalLogSinkSet *)pNVar1);
    return;
  }
  pNVar1 = &anon_unknown_0::GlobalSinks::global_sinks;
  local_10.mu_ = (Mutex *)&anon_unknown_0::GlobalSinks::global_sinks;
  Mutex::ReaderLock((Mutex *)&anon_unknown_0::GlobalSinks::global_sinks);
  *(undefined1 *)(in_FS_OFFSET + -0x34) = 1;
  anon_unknown_0::GlobalLogSinkSet::FlushLogSinksLocked((GlobalLogSinkSet *)pNVar1);
  *(undefined1 *)(in_FS_OFFSET + -0x34) = 0;
  ReaderMutexLock::~ReaderMutexLock(&local_10);
  return;
}

Assistant:

void FlushLogSinks() { log_internal::GlobalSinks().FlushLogSinks(); }